

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void fix_feedback_for_inter(Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object feedback_owner;
  Am_Object local_20;
  Am_Object feedback;
  Am_Object widget;
  Am_Object *inter_local;
  
  Am_Object::Get_Owner(&feedback,(Am_Slot_Flags)inter);
  in_value = Am_Object::Get(inter,0xdc,0);
  Am_Object::Am_Object(&local_20,in_value);
  Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)&local_20);
  bVar1 = Am_Object::operator!=(&local_38,&feedback);
  if (bVar1) {
    Am_Object::Remove_From_Owner(&local_20);
    Am_Object::Am_Object(&local_40,&local_20);
    Am_Object::Add_Part(&feedback,&local_40,true,0);
    Am_Object::~Am_Object(&local_40);
  }
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&feedback);
  return;
}

Assistant:

void
fix_feedback_for_inter(Am_Object &inter)
{
  Am_Object widget = inter.Get_Owner();
  Am_Object feedback = inter.Get(Am_FEEDBACK_OBJECT);
  Am_Object feedback_owner = feedback.Get_Owner();
  if (feedback_owner != widget) {
    feedback.Remove_From_Owner();
    widget.Add_Part(feedback);
  }
}